

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

bool cmFileAPI::ReadRequestVersion
               (Value *version,bool inArray,
               vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *result
               ,string *error)

{
  pointer *ppRVar1;
  iterator __position;
  bool bVar2;
  UInt UVar3;
  Value *pVVar4;
  char *pcVar5;
  char *pcVar6;
  RequestVersion v;
  RequestVersion local_30;
  
  bVar2 = Json::Value::isUInt(version);
  if (bVar2) {
    local_30.Major = 0;
    local_30.Minor = 0;
    UVar3 = Json::Value::asUInt(version);
    local_30.Major = UVar3;
LAB_0047ae03:
    __position._M_current =
         (result->
         super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (result->
        super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmFileAPI::RequestVersion,std::allocator<cmFileAPI::RequestVersion>>::
      _M_realloc_insert<cmFileAPI::RequestVersion_const&>
                ((vector<cmFileAPI::RequestVersion,std::allocator<cmFileAPI::RequestVersion>> *)
                 result,__position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      ppRVar1 = &(result->
                 super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar1 = *ppRVar1 + 1;
    }
    bVar2 = true;
  }
  else {
    bVar2 = Json::Value::isObject(version);
    if (bVar2) {
      pVVar4 = Json::Value::operator[](version,"major");
      bVar2 = Json::Value::isNull(pVVar4);
      if (bVar2) {
        pcVar6 = (char *)error->_M_string_length;
        pcVar5 = "\'version\' object \'major\' member missing";
      }
      else {
        bVar2 = Json::Value::isUInt(pVVar4);
        if (bVar2) {
          local_30.Major = 0;
          local_30.Minor = 0;
          UVar3 = Json::Value::asUInt(pVVar4);
          local_30.Major = UVar3;
          pVVar4 = Json::Value::operator[](version,"minor");
          bVar2 = Json::Value::isUInt(pVVar4);
          if (bVar2) {
            UVar3 = Json::Value::asUInt(pVVar4);
            local_30.Minor = UVar3;
          }
          else {
            bVar2 = Json::Value::isNull(pVVar4);
            if (!bVar2) {
              std::__cxx11::string::operator=
                        ((string *)error,
                         "\'version\' object \'minor\' member is not a non-negative integer");
              return false;
            }
          }
          goto LAB_0047ae03;
        }
        pcVar6 = (char *)error->_M_string_length;
        pcVar5 = "\'version\' object \'major\' member is not a non-negative integer";
      }
    }
    else {
      pcVar6 = (char *)error->_M_string_length;
      if (inArray) {
        pcVar5 = "\'version\' array entry is not a non-negative integer or object";
      }
      else {
        pcVar5 = "\'version\' member is not a non-negative integer, object, or array";
      }
    }
    bVar2 = false;
    std::__cxx11::string::_M_replace((ulong)error,0,pcVar6,(ulong)pcVar5);
  }
  return bVar2;
}

Assistant:

bool cmFileAPI::ReadRequestVersion(Json::Value const& version, bool inArray,
                                   std::vector<RequestVersion>& result,
                                   std::string& error)
{
  if (version.isUInt()) {
    RequestVersion v;
    v.Major = version.asUInt();
    result.push_back(v);
    return true;
  }

  if (!version.isObject()) {
    if (inArray) {
      error = "'version' array entry is not a non-negative integer or object";
    } else {
      error =
        "'version' member is not a non-negative integer, object, or array";
    }
    return false;
  }

  Json::Value const& major = version["major"];
  if (major.isNull()) {
    error = "'version' object 'major' member missing";
    return false;
  }
  if (!major.isUInt()) {
    error = "'version' object 'major' member is not a non-negative integer";
    return false;
  }

  RequestVersion v;
  v.Major = major.asUInt();

  Json::Value const& minor = version["minor"];
  if (minor.isUInt()) {
    v.Minor = minor.asUInt();
  } else if (!minor.isNull()) {
    error = "'version' object 'minor' member is not a non-negative integer";
    return false;
  }

  result.push_back(v);

  return true;
}